

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonChain.cpp
# Opt level: O2

Value * __thiscall xmrig::JsonChain::getArray(JsonChain *this,char *key)

{
  pointer this_00;
  pointer pGVar1;
  pointer pGVar2;
  ConstMemberIterator CVar3;
  pointer pGVar4;
  
  pGVar4 = (this->m_chain).
           super__Vector_base<rapidjson::GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>,_std::allocator<rapidjson::GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (pGVar4 == (this->m_chain).
                  super__Vector_base<rapidjson::GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>,_std::allocator<rapidjson::GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>_>_>
                  ._M_impl.super__Vector_impl_data._M_start) {
      return (Value *)kNullValue;
    }
    this_00 = pGVar4 + -1;
    CVar3 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::FindMember(&this_00->
                          super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                         ,key);
    pGVar2 = pGVar4 + -1;
    pGVar1 = pGVar4 + -1;
    pGVar4 = this_00;
  } while ((CVar3.ptr_ ==
            (Pointer)((ulong)(pGVar1->
                             super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                             ).data_.s.length * 0x20 +
                     ((ulong)(pGVar2->
                             super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                             ).data_.s.str & 0xffffffffffff))) ||
          (((CVar3.ptr_)->value).data_.f.flags != 4));
  return &(CVar3.ptr_)->value;
}

Assistant:

const rapidjson::Value &xmrig::JsonChain::getArray(const char *key) const
{
    for (auto it = m_chain.rbegin(); it != m_chain.rend(); ++it) {
        auto i = it->FindMember(key);
        if (i != it->MemberEnd() && i->value.IsArray()) {
            return i->value;
        }
    }

    return kNullValue;
}